

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void forstat(LexState *ls,int line)

{
  int iVar1;
  FuncState *fs_00;
  undefined1 local_40 [8];
  BlockCnt bl;
  TString *varname;
  FuncState *fs;
  int line_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  enterblock(fs_00,(BlockCnt *)local_40,'\x01');
  luaX_next(ls);
  bl._16_8_ = str_checkname(ls);
  iVar1 = (ls->t).token;
  if (iVar1 != 0x2c) {
    if (iVar1 == 0x3d) {
      fornum(ls,(TString *)bl._16_8_,line);
      goto LAB_00121c6b;
    }
    if (iVar1 != 0x10c) {
      luaX_syntaxerror(ls,"\'=\' or \'in\' expected");
    }
  }
  forlist(ls,(TString *)bl._16_8_);
LAB_00121c6b:
  check_match(ls,0x106,0x108,line);
  leaveblock(fs_00);
  return;
}

Assistant:

static void forstat (LexState *ls, int line) {
  /* forstat -> FOR (fornum | forlist) END */
  FuncState *fs = ls->fs;
  TString *varname;
  BlockCnt bl;
  enterblock(fs, &bl, 1);  /* scope for loop and control variables */
  luaX_next(ls);  /* skip 'for' */
  varname = str_checkname(ls);  /* first variable name */
  switch (ls->t.token) {
    case '=': fornum(ls, varname, line); break;
    case ',': case TK_IN: forlist(ls, varname); break;
    default: luaX_syntaxerror(ls, "'=' or 'in' expected");
  }
  check_match(ls, TK_END, TK_FOR, line);
  leaveblock(fs);  /* loop scope ('break' jumps to this point) */
}